

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O1

void wabt::interp::WriteTrap(Stream *stream,char *desc,Ptr *trap)

{
  pointer pcVar1;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = (trap->obj_->message_)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (trap->obj_->message_)._M_string_length);
  Stream::Writef(stream,"%s: %s\n",desc,local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void WriteTrap(Stream* stream, const char* desc, const Trap::Ptr& trap) {
  stream->Writef("%s: %s\n", desc, trap->message().c_str());
}